

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

void __thiscall rengine::Signal<>::emit(Signal<> *this,SignalEmitter *emitter)

{
  bool bVar1;
  Bucket *pBVar2;
  reference ppSVar3;
  SignalHandler<> *handler;
  iterator __end0;
  iterator __begin0;
  vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_> *__range3;
  Bucket *bucket;
  SignalEmitter *emitter_local;
  Signal<> *this_local;
  
  pBVar2 = findBucket(this,emitter);
  if (pBVar2 != (Bucket *)0x0) {
    __end0 = std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>::
             begin(&pBVar2->handlers);
    handler = (SignalHandler<> *)
              std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>::
              end(&pBVar2->handlers);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<rengine::SignalHandler<>_**,_std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>_>
                                       *)&handler), bVar1) {
      ppSVar3 = __gnu_cxx::
                __normal_iterator<rengine::SignalHandler<>_**,_std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>_>
                ::operator*(&__end0);
      (*(*ppSVar3)->_vptr_SignalHandler[2])();
      __gnu_cxx::
      __normal_iterator<rengine::SignalHandler<>_**,_std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>_>
      ::operator++(&__end0);
    }
  }
  return;
}

Assistant:

void emit(SignalEmitter *emitter, Arguments ... args)
    {
        if (Bucket *bucket = findBucket(emitter)) {
            for (auto handler : bucket->handlers)
                handler->onSignal(args...);
        }
    }